

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O3

int metacall_initialize_ex(metacall_initialize_configuration_type *initialize_config)

{
  int iVar1;
  loader_impl plVar2;
  size_t line;
  char *message;
  char *tag;
  
  iVar1 = metacall_initialize();
  if (iVar1 == 0) {
    while( true ) {
      if ((initialize_config->tag == (char *)0x0) && (initialize_config->options == (void *)0x0)) {
        return 0;
      }
      plVar2 = loader_get_impl(initialize_config->tag);
      tag = initialize_config->tag;
      if (plVar2 == (loader_impl)0x0) {
        message = "MetaCall failed to find \'%s_loader\'";
        line = 0x166;
        goto LAB_00124ab6;
      }
      loader_set_options(tag,initialize_config->options);
      iVar1 = loader_get_option_host(initialize_config->tag);
      if ((iVar1 != 0) && (iVar1 = loader_initialize_host(initialize_config->tag), iVar1 != 0))
      break;
      initialize_config = initialize_config + 1;
    }
    tag = initialize_config->tag;
    message = "MetaCall failed to initialize \'%s_loader\' as host";
    line = 0x171;
LAB_00124ab6:
    log_write_impl_va("metacall",line,"metacall_initialize_ex",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                      ,LOG_LEVEL_ERROR,message,tag);
  }
  return 1;
}

Assistant:

int metacall_initialize_ex(struct metacall_initialize_configuration_type initialize_config[])
{
	size_t index = 0;

	if (metacall_initialize() == 1)
	{
		return 1;
	}

	while (!(initialize_config[index].tag == NULL && initialize_config[index].options == NULL))
	{
		loader_impl impl = loader_get_impl(initialize_config[index].tag);

		if (impl == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "MetaCall failed to find '%s_loader'", initialize_config[index].tag);
			return 1;
		}

		loader_set_options(initialize_config[index].tag, initialize_config[index].options);

		/* If we are initializing a loader as a host, we must initialize it */
		if (loader_get_option_host(initialize_config[index].tag))
		{
			if (loader_initialize_host(initialize_config[index].tag) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "MetaCall failed to initialize '%s_loader' as host", initialize_config[index].tag);
				return 1;
			}
		}

		++index;
	}

	return 0;
}